

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_error.c
# Opt level: O3

void eprintf(char *fmt,char *file,int line,...)

{
  FILE *__stream;
  char in_AL;
  size_t sVar1;
  int *piVar2;
  char *pcVar3;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_f8;
  void **local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [24];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  fflush(_stderr);
  fprintf(_stderr,"%s:%d: ",file,(ulong)(uint)line);
  local_f8 = 0x3000000018;
  local_f0 = &args[0].overflow_arg_area;
  local_e8 = local_d8;
  vfprintf(_stderr,fmt,&local_f8);
  if (*fmt != '\0') {
    sVar1 = strlen(fmt);
    __stream = _stderr;
    if (fmt[sVar1 - 1] == ':') {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fprintf(__stream," %s",pcVar3);
    }
  }
  fputc(10,_stderr);
  exit(2);
}

Assistant:

void eprintf(const char *fmt, const char *file, int line, ...)
{
    va_list args;

    fflush(stderr);

    fprintf(stderr, "%s:%d: ", file, line);
    va_start(args, line);
    vfprintf(stderr, fmt, args);
    va_end(args);

    /*include system error information if format ends in colon */
    if(fmt[0] != '\0' && fmt[strlen(fmt) - 1] == ':')
        fprintf(stderr, " %s", strerror(errno));
    fprintf(stderr, "\n");

    exit(2);
}